

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QString * QFileSystemEngine::tempPath(void)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QString temp;
  size_t in_stack_ffffffffffffff80;
  QString *str;
  QString *in_stack_ffffffffffffff98;
  QDir *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  QString *path;
  QDir *in_stack_ffffffffffffffc0;
  QLatin1StringView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  path = in_RDI;
  qEnvironmentVariable(in_stack_ffffffffffffffa8);
  bVar2 = QString::isEmpty((QString *)0x6a17fd);
  if (bVar2) {
    QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)str,in_stack_ffffffffffffff80);
    QString::operator=((QString *)QVar3.m_data,in_stack_ffffffffffffffd0);
  }
  QDir::cleanPath(in_stack_ffffffffffffff98);
  QDir::QDir(in_stack_ffffffffffffffc0,path);
  QDir::canonicalPath(in_stack_ffffffffffffffa0);
  QDir::~QDir((QDir *)0x6a188a);
  QString::~QString((QString *)0x6a1894);
  QString::~QString((QString *)0x6a189e);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QFileSystemEngine::tempPath()
{
#ifdef QT_UNIX_TEMP_PATH_OVERRIDE
    return QT_UNIX_TEMP_PATH_OVERRIDE ""_L1;
#else
    QString temp = qEnvironmentVariable("TMPDIR");
    if (temp.isEmpty()) {
        if (false) {
#if defined(Q_OS_DARWIN) && !defined(QT_BOOTSTRAPPED)
        } else if (NSString *nsPath = NSTemporaryDirectory()) {
            temp = QString::fromCFString((CFStringRef)nsPath);
#endif
        } else {
            temp = _PATH_TMP ""_L1;
        }
    }
    return QDir(QDir::cleanPath(temp)).canonicalPath();
#endif
}